

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O0

fdtd3D * init_fdtd_3D_cpml(float_type *domain_size,float_type Sc,float_type smallest_wavelength,
                          border_condition *borders,uintmax_t cpml_thickness)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uintmax_t uVar4;
  uintmax_t uVar5;
  uintmax_t uVar6;
  void *pvVar7;
  float_type *pfVar8;
  void *in_RCX;
  border_condition *in_RDX;
  double *in_RSI;
  fdtd3D *in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float_type fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double in_XMM1_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uintmax_t d;
  float_type sigma_max;
  float_type alpha_max;
  float_type Sc_max;
  uintmax_t sizeZ;
  uintmax_t sizeY;
  uintmax_t sizeX;
  float_type sizeZf;
  float_type sizeYf;
  float_type sizeXf;
  float_type dt;
  float_type dz;
  float_type dy;
  float_type dx;
  fdtd3D *sigma_max_00;
  double CPML_region_width;
  
  dVar9 = in_XMM1_Qa / 20.0;
  dVar10 = (dVar9 * in_XMM0_Qa) / 299792458.0;
  auVar15._0_8_ = *in_RSI / dVar9;
  auVar15._8_8_ = 0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar15._0_8_;
  auVar15 = vroundsd_avx(auVar15,auVar18,10);
  auVar16._0_8_ = in_RSI[1] / dVar9;
  auVar16._8_8_ = 0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar16._0_8_;
  auVar16 = vroundsd_avx(auVar16,auVar19,10);
  auVar17._0_8_ = in_RSI[2] / dVar9;
  auVar17._8_8_ = 0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar17._0_8_;
  auVar17 = vroundsd_avx(auVar17,auVar20,10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = auVar15._0_8_;
  uVar4 = vcvttsd2usi_avx512f(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = auVar16._0_8_;
  uVar5 = vcvttsd2usi_avx512f(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar17._0_8_;
  uVar6 = vcvttsd2usi_avx512f(auVar3);
  sigma_max_00 = in_RDI;
  dVar11 = sqrt(3.0);
  dVar11 = 1.0 / dVar11;
  if (dVar11 < in_XMM0_Qa) {
    fprintf(_stderr,
            "The value of Sc is too high, the simulation may be unstable. Please use a value lesser or equal to %.5f\n"
            ,dVar11);
  }
  in_RDI->dx = dVar9;
  in_RDI->dy = dVar9;
  in_RDI->dz = dVar9;
  in_RDI->dt = dVar10;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->hx = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->hy = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->hz = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->ex = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->ey = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->ez = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->permittivity_inv = pvVar7;
  pvVar7 = calloc(1,uVar4 * uVar5 * uVar6 * 8);
  in_RDI->permeability_inv = pvVar7;
  in_RDI->psi_hx_y[0] = (void *)0x0;
  in_RDI->psi_hx_y[1] = (void *)0x0;
  in_RDI->psi_hx_z[0] = (void *)0x0;
  in_RDI->psi_hx_z[1] = (void *)0x0;
  in_RDI->psi_hy_x[0] = (void *)0x0;
  in_RDI->psi_hy_x[1] = (void *)0x0;
  in_RDI->psi_hy_z[0] = (void *)0x0;
  in_RDI->psi_hy_z[1] = (void *)0x0;
  in_RDI->psi_hz_x[0] = (void *)0x0;
  in_RDI->psi_hz_x[1] = (void *)0x0;
  in_RDI->psi_hz_y[0] = (void *)0x0;
  in_RDI->psi_hz_y[1] = (void *)0x0;
  in_RDI->psi_ex_y[0] = (void *)0x0;
  in_RDI->psi_ex_y[1] = (void *)0x0;
  in_RDI->psi_ex_z[0] = (void *)0x0;
  in_RDI->psi_ex_z[1] = (void *)0x0;
  in_RDI->psi_ey_x[0] = (void *)0x0;
  in_RDI->psi_ey_x[1] = (void *)0x0;
  in_RDI->psi_ey_z[0] = (void *)0x0;
  in_RDI->psi_ey_z[1] = (void *)0x0;
  in_RDI->psi_ez_x[0] = (void *)0x0;
  in_RDI->psi_ez_x[1] = (void *)0x0;
  in_RDI->psi_ez_y[0] = (void *)0x0;
  in_RDI->psi_ez_y[1] = (void *)0x0;
  in_RDI->bx = (float_type *)0x0;
  in_RDI->by = (float_type *)0x0;
  in_RDI->bz = (float_type *)0x0;
  in_RDI->cx = (float_type *)0x0;
  in_RDI->cy = (float_type *)0x0;
  in_RDI->cz = (float_type *)0x0;
  in_RDI->cpml_thickness = (uintmax_t)in_RCX;
  in_RDI->border_condition[0] = *in_RDX;
  in_RDI->border_condition[1] = in_RDX[1];
  in_RDI->border_condition[2] = in_RDX[2];
  in_RDI->border_condition[3] = in_RDX[3];
  in_RDI->border_condition[4] = in_RDX[4];
  in_RDI->border_condition[5] = in_RDX[5];
  in_RDI->domain_size[0] = *in_RSI;
  in_RDI->domain_size[1] = in_RSI[1];
  in_RDI->domain_size[2] = in_RSI[2];
  in_RDI->sizeX = uVar4;
  in_RDI->sizeY = uVar5;
  in_RDI->sizeZ = uVar6;
  in_RDI->Sc = in_XMM0_Qa;
  in_RDI->num_Jsources = 0;
  in_RDI->Jsources = (fdtd_source *)0x0;
  in_RDI->JsourceLocations = (void *)0x0;
  in_RDI->num_Msources = 0;
  in_RDI->Msources = (fdtd_source *)0x0;
  in_RDI->MsourceLocations = (void *)0x0;
  in_RDI->time = 0.0;
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[0] & border_cpml) != 0)) {
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_hx_z[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_hy_z[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_ex_z[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_ey_z[0] = pvVar7;
  }
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[1] & border_cpml) != 0)) {
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_hx_z[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_hy_z[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_ex_z[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * uVar5 * (long)in_RCX * 8);
    in_RDI->psi_ey_z[1] = pvVar7;
  }
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[3] & border_cpml) != 0)) {
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_hy_x[0] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_hz_x[0] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_ey_x[0] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_ez_x[0] = pvVar7;
  }
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[2] & border_cpml) != 0)) {
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_hy_x[1] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_hz_x[1] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_ey_x[1] = pvVar7;
    pvVar7 = calloc(1,(long)in_RCX * uVar5 * uVar6 * 8);
    in_RDI->psi_ez_x[1] = pvVar7;
  }
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[5] & border_cpml) != 0)) {
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_hx_y[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_hz_y[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_ex_y[0] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_ez_y[0] = pvVar7;
  }
  if ((in_RCX != (void *)0x0) && ((in_RDI->border_condition[4] & border_cpml) != 0)) {
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_hx_y[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_hz_y[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_ex_y[1] = pvVar7;
    pvVar7 = calloc(1,uVar4 * (long)in_RCX * uVar6 * 8);
    in_RDI->psi_ez_y[1] = pvVar7;
  }
  pfVar8 = (float_type *)calloc((size_t)in_RCX,8);
  in_RDI->bx = pfVar8;
  in_RDI->by = in_RDI->bx;
  in_RDI->bz = in_RDI->bx;
  pfVar8 = (float_type *)calloc((size_t)in_RCX,8);
  in_RDI->cx = pfVar8;
  in_RDI->cy = in_RDI->cx;
  in_RDI->cz = in_RDI->cx;
  CPML_region_width = in_RDI->dx * 5.563250280268093e-11 * 0.1;
  dVar13 = in_RDI->dx;
  dVar12 = sqrt(141925.72908100396);
  dVar13 = 4.0 / (dVar13 * dVar12);
  for (pvVar7 = (void *)0x0; pvVar7 < in_RCX; pvVar7 = (void *)((long)pvVar7 + 1)) {
    fVar14 = b((uintmax_t)dVar11,(uintmax_t)CPML_region_width,dVar13,(float_type)pvVar7,
               (float_type)sigma_max_00);
    in_RDI->bx[(long)in_RCX + (-1 - (long)pvVar7)] = fVar14;
    fVar14 = in_RDI->dt;
    c(pvVar7,(void *)((long)in_RCX - 1));
    in_RDI->cx[(long)in_RCX + (-1 - (long)pvVar7)] = fVar14;
  }
  fprintf(_stderr,"Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n",dVar10,dVar9,dVar9,dVar9,
          auVar15._0_8_,auVar16._0_8_,auVar17._0_8_);
  return sigma_max_00;
}

Assistant:

struct fdtd3D init_fdtd_3D_cpml(float_type domain_size[3], float_type Sc,
                                float_type smallest_wavelength,
                                enum border_condition borders[num_borders_3D],
                                uintmax_t cpml_thickness) {

  float_type dx = smallest_wavelength / float_cst(20.);
  float_type dy = dx;
  float_type dz = dx;
  float_type dt = dx * Sc / c_light;
  float_type sizeXf = ceil(domain_size[0] / dx);
  float_type sizeYf = ceil(domain_size[1] / dy);
  float_type sizeZf = ceil(domain_size[2] / dy);
  uintmax_t sizeX = (uintmax_t)sizeXf;
  uintmax_t sizeY = (uintmax_t)sizeYf;
  uintmax_t sizeZ = (uintmax_t)sizeZf;
  float_type Sc_max = float_cst(1.) / sqrt(float_cst(3.));
  if (Sc > Sc_max)
    fprintf(stderr,
            "The value of Sc is too high, the simulation may be unstable. "
            "Please use a value lesser or equal to %.5f\n",
            Sc_max);

  struct fdtd3D fdtd = {
      .dx = dx,
      .dy = dy,
      .dz = dz,
      .dt = dt,
      .hx = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hy = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hz = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ex = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ey = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ez = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permittivity_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permeability_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .psi_hx_y = {NULL, NULL},
      .psi_hx_z = {NULL, NULL},
      .psi_hy_x = {NULL, NULL},
      .psi_hy_z = {NULL, NULL},
      .psi_hz_x = {NULL, NULL},
      .psi_hz_y = {NULL, NULL},
      .psi_ex_y = {NULL, NULL},
      .psi_ex_z = {NULL, NULL},
      .psi_ey_x = {NULL, NULL},
      .psi_ey_z = {NULL, NULL},
      .psi_ez_x = {NULL, NULL},
      .psi_ez_y = {NULL, NULL},
      .bx = NULL,
      .by = NULL,
      .bz = NULL,
      .cx = NULL,
      .cy = NULL,
      .cz = NULL,
      .cpml_thickness = cpml_thickness,
      .border_condition =
          {
              [border_front] = borders[border_front],
              [border_back] = borders[border_back],
              [border_top] = borders[border_top],
              [border_bottom] = borders[border_bottom],
              [border_right] = borders[border_right],
              [border_left] = borders[border_left],
          },
      .domain_size = {domain_size[0], domain_size[1], domain_size[2]},
      .sizeX = sizeX,
      .sizeY = sizeY,
      .sizeZ = sizeZ,
      .Sc = Sc,
      .num_Jsources = 0,
      .Jsources = NULL,
      .JsourceLocations = NULL,
      .num_Msources = 0,
      .Msources = NULL,
      .MsourceLocations = NULL,
      .time = float_cst(0.),
  };

  if (cpml_thickness > 0 && fdtd.border_condition[border_front] & border_cpml) {
    fdtd.psi_hx_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_back] & border_cpml) {
    fdtd.psi_hx_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 &&
      fdtd.border_condition[border_bottom] & border_cpml) {
    fdtd.psi_hy_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_top] & border_cpml) {
    fdtd.psi_hy_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_left] & border_cpml) {
    fdtd.psi_hx_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_right] & border_cpml) {
    fdtd.psi_hx_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  fdtd.bx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.by = fdtd.bx;
  fdtd.bz = fdtd.bx;
  fdtd.cx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.cy = fdtd.cx;
  fdtd.cz = fdtd.cx;
  float_type alpha_max = float_cst(2.) * M_PI * eps0 * fdtd.dx * float_cst(0.1);
  float_type sigma_max = float_cst(0.8) * (polynomial_taper_order + 1) /
                         (fdtd.dx * sqrt(mu0 / eps0));
  for (uintmax_t d = 0; d < cpml_thickness; ++d) {
    // store from border of domain to interface CPML / simulation medium
    fdtd.bx[cpml_thickness - d - 1] =
        b(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
    fdtd.cx[cpml_thickness - d - 1] =
        c(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
  }

  fprintf(stderr, "Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n", dt, dx, dy, dz,
          sizeXf, sizeYf, sizeZf);

  return fdtd;
}